

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ObjMergeOrder(Nf_Man_t *p,int iObj)

{
  uint *puVar1;
  uint uVar2;
  float *pfVar3;
  undefined8 uVar4;
  Jf_Par_t *pJVar5;
  Gia_Obj_t *pGVar6;
  ulong *puVar7;
  ulong *puVar8;
  Vec_Mem_t *pVVar9;
  word **ppwVar10;
  int iVar11;
  word wVar12;
  word wVar13;
  word wVar14;
  word wVar15;
  int Count;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  Gia_Man_t *pGVar20;
  ulong uVar21;
  void *pvVar22;
  void **ppvVar23;
  int i;
  ulong uVar24;
  char *__function;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  char *__file;
  int iVar33;
  uint uVar34;
  long lVar35;
  undefined1 *puVar36;
  uint uVar37;
  ulong uVar38;
  word wVar39;
  Nf_Cut_t *pNVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  int *piVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  int *piVar51;
  uint uVar52;
  int iVar53;
  word *pwVar54;
  int iVar55;
  uint uVar56;
  Gia_Obj_t *pGVar57;
  Nf_Cut_t *pNVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  Nf_Cut_t *pCutsR [32];
  Nf_Cut_t pCuts2 [32];
  Nf_Cut_t pCuts0 [32];
  Nf_Cut_t pCuts1 [32];
  Nf_Cut_t pCuts [32];
  Nf_Cut_t *local_19b0;
  uint local_197c;
  ulong local_1940;
  Nf_Cut_t *local_1938;
  long local_1930 [31];
  Nf_Cut_t local_1838 [32];
  Nf_Cut_t local_1238 [32];
  Nf_Cut_t local_c38 [32];
  undefined1 local_638 [1544];
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_006fafc7:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar56 = iObj * 2;
  uVar31 = (p->vFlowRefs).nSize;
  if ((uVar31 == uVar56 || SBORROW4(uVar31,uVar56) != (int)(uVar31 + iObj * -2) < 0) ||
     (uVar31 <= (uVar56 | 1))) {
LAB_006fae53:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  pGVar57 = p->pGia->pObjs + (uint)iObj;
  pfVar3 = (p->vFlowRefs).pArray;
  fVar59 = pfVar3[uVar56] + pfVar3[uVar56 | 1];
  uVar31 = p->pPars->nLutSize;
  uVar24 = (ulong)uVar31;
  uVar56 = p->pPars->nCutNum;
  iVar16 = Nf_ManPrepareCuts(local_1238,p,iObj - (*(uint *)pGVar57 & 0x1fffffff),1);
  iVar17 = Nf_ManPrepareCuts(local_c38,p,iObj - (*(uint *)&pGVar57->field_0x4 & 0x1fffffff),1);
  uVar21 = *(ulong *)pGVar57;
  pGVar20 = p->pGia;
  piVar47 = pGVar20->pSibls;
  if (piVar47 == (int *)0x0) {
    iVar18 = 0;
  }
  else {
    iVar18 = piVar47[(uint)iObj];
  }
  uVar37 = (uint)uVar21 & 0x1fffffff;
  uVar34 = (uint)(uVar21 >> 0x20);
  if ((-1 < (int)(uint)uVar21 && uVar37 != 0x1fffffff) && uVar37 == (uVar34 & 0x1fffffff)) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x36d,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
  }
  if (0 < (int)uVar56) {
    lVar35 = (ulong)uVar56 - 1;
    auVar61._8_4_ = (int)lVar35;
    auVar61._0_8_ = lVar35;
    auVar61._12_4_ = (int)((ulong)lVar35 >> 0x20);
    puVar36 = local_638;
    lVar35 = 0;
    auVar61 = auVar61 ^ _DAT_007ee2e0;
    auVar63 = _DAT_007ee2d0;
    do {
      auVar64 = auVar63 ^ _DAT_007ee2e0;
      if ((bool)(~(auVar64._4_4_ == auVar61._4_4_ && auVar61._0_4_ < auVar64._0_4_ ||
                  auVar61._4_4_ < auVar64._4_4_) & 1)) {
        *(undefined1 **)((long)local_1930 + lVar35 + -8) = puVar36;
      }
      if ((auVar64._12_4_ != auVar61._12_4_ || auVar64._8_4_ <= auVar61._8_4_) &&
          auVar64._12_4_ <= auVar61._12_4_) {
        *(undefined1 **)((long)local_1930 + lVar35) = puVar36 + 0x30;
      }
      lVar29 = auVar63._8_8_;
      auVar63._0_8_ = auVar63._0_8_ + 2;
      auVar63._8_8_ = lVar29 + 2;
      lVar35 = lVar35 + 0x10;
      puVar36 = puVar36 + 0x60;
    } while ((ulong)(uVar56 + 1 >> 1) << 4 != lVar35);
  }
  if (iVar18 == 0) {
    uVar37 = 0;
  }
  else {
    iVar33 = piVar47[(uint)iObj];
    if (((long)iVar33 < 0) || (pGVar20->nObjs <= iVar33)) goto LAB_006fafc7;
    uVar4 = *(undefined8 *)(pGVar20->pObjs + iVar33);
    pNVar40 = local_1838;
    iVar18 = Nf_ManPrepareCuts(pNVar40,p,iVar18,0);
    uVar37 = 0;
    if (0 < iVar18) {
      uVar37 = 0;
      do {
        pwVar54 = (word *)local_1930[(long)(int)uVar37 + -1];
        wVar39 = pNVar40->Sign;
        wVar12 = *(word *)&pNVar40->Delay;
        wVar13 = *(word *)(pNVar40->pLeaves + 1);
        wVar14 = *(word *)(pNVar40->pLeaves + 3);
        wVar15 = *(word *)(pNVar40->pLeaves + 5);
        pwVar54[2] = *(word *)&pNVar40->field_0x10;
        pwVar54[3] = wVar13;
        pwVar54[4] = wVar14;
        pwVar54[5] = wVar15;
        *pwVar54 = wVar39;
        pwVar54[1] = wVar12;
        uVar52 = (uint)pwVar54[2];
        *(uint *)(pwVar54 + 2) =
             uVar52 & 0xfc000000 |
             uVar52 & 0x3ffffff ^ ((uint)((ulong)uVar4 >> 0x20) ^ uVar34) >> 0x1f;
        uVar26 = uVar52 >> 0x1b;
        pJVar5 = p->pPars;
        if (pJVar5->nLutSize < (int)uVar26) {
LAB_006faecf:
          __assert_fail("nLeaves <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x353,"void Nf_CutParams(Nf_Man_t *, Nf_Cut_t *, float)");
        }
        pwVar54[1] = 0;
        fVar60 = 0.0;
        fVar62 = 0.0;
        if (0x7ffffff < uVar52) {
          uVar38 = 0;
          iVar33 = 0;
          do {
            iVar44 = *(int *)((long)pwVar54 + uVar38 * 4 + 0x14);
            lVar35 = (long)iVar44;
            if ((lVar35 < 0) || ((p->vCutDelays).nSize <= iVar44)) {
LAB_006fae15:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar30 = (p->vCutDelays).pArray[lVar35];
            if (iVar33 <= iVar30) {
              iVar33 = iVar30;
            }
            *(int *)(pwVar54 + 1) = iVar33;
            if ((p->vCutFlows).nSize <= iVar44) goto LAB_006fae53;
            fVar60 = fVar60 + (p->vCutFlows).pArray[lVar35];
            *(float *)((long)pwVar54 + 0xc) = fVar60;
            uVar38 = uVar38 + 1;
          } while (uVar26 != uVar38);
          *(uint *)(pwVar54 + 1) = (iVar33 + 1) - (uint)(uVar52 < 0x10000000);
          fVar62 = 0.0;
          if (0xfffffff < uVar52) {
            fVar62 = (float)(int)(uVar26 + pJVar5->nAreaTuner);
          }
        }
        *(float *)((long)pwVar54 + 0xc) = (fVar60 + fVar62) / fVar59;
        uVar37 = Nf_SetAddCut(&local_1938,uVar37,uVar56);
        pNVar40 = pNVar40 + 1;
      } while (pNVar40 < local_1838 + iVar18);
    }
    pGVar20 = p->pGia;
  }
  uVar52 = (uint)(uVar21 >> 0x1d) & 1;
  uVar34 = uVar34 >> 0x1d & 1;
  if (pGVar20->pMuxes != (uint *)0x0) {
    uVar26 = pGVar20->pMuxes[(uint)iObj];
    if (uVar26 != 0) {
      if ((int)uVar26 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      iVar18 = Nf_ManPrepareCuts(local_1838,p,uVar26 >> 1,1);
      pGVar20 = p->pGia;
      if (pGVar20->pMuxes == (uint *)0x0) {
        local_197c = 0;
      }
      else {
        pGVar6 = pGVar20->pObjs;
        if ((pGVar57 < pGVar6) || (pGVar6 + pGVar20->nObjs <= pGVar57)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        local_197c = pGVar20->pMuxes
                     [(int)((ulong)((long)pGVar57 - (long)pGVar6) >> 2) * -0x55555555];
        if ((int)local_197c < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10d,"int Abc_LitIsCompl(int)");
        }
        local_197c = local_197c & 1;
      }
      pNVar40 = local_1238;
      p->CutCount[0] = (double)(iVar17 * iVar16 * iVar18) + p->CutCount[0];
      if (0 < iVar16) {
        do {
          if (0 < iVar17) {
            local_19b0 = local_c38;
            do {
              if (0 < iVar18) {
                pNVar58 = local_1838;
LAB_006fa285:
                uVar21 = local_19b0->Sign | pNVar40->Sign | pNVar58->Sign;
                uVar21 = uVar21 - (uVar21 >> 1 & 0x5555555555555555);
                uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
                if ((int)(uint)(byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38) <= (int)uVar31) {
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  puVar7 = (ulong *)local_1930[(long)(int)uVar37 + -1];
                  uVar26 = *(uint *)&pNVar40->field_0x10;
                  uVar46 = *(uint *)&local_19b0->field_0x10;
                  uVar32 = *(uint *)&pNVar58->field_0x10;
                  bVar25 = 0;
                  iVar33 = -0x3ffffff;
                  uVar21 = 0;
                  uVar41 = 0;
                  uVar45 = 0;
                  uVar49 = 0;
                  while( true ) {
                    iVar30 = 1000000000;
                    iVar44 = 1000000000;
                    if (uVar49 != uVar26 >> 0x1b) {
                      iVar44 = pNVar40->pLeaves[uVar49];
                    }
                    if (uVar45 != uVar46 >> 0x1b) {
                      iVar30 = local_19b0->pLeaves[uVar45];
                    }
                    iVar55 = 1000000000;
                    if (uVar41 != uVar32 >> 0x1b) {
                      iVar55 = pNVar58->pLeaves[uVar41];
                    }
                    iVar11 = iVar30;
                    if (iVar44 < iVar30) {
                      iVar11 = iVar44;
                    }
                    iVar53 = iVar55;
                    if (iVar11 < iVar55) {
                      iVar53 = iVar11;
                    }
                    if (iVar53 == 1000000000) {
                      *(uint *)(puVar7 + 2) = ((uint)puVar7[2] & 0x4000000) - iVar33;
                      uVar38 = local_19b0->Sign | pNVar40->Sign | pNVar58->Sign;
                      *puVar7 = uVar38;
                      if ((int)uVar37 < 1) goto LAB_006fa4c2;
                      uVar26 = (uint)uVar21 & 0x1f;
                      uVar21 = 0;
                      goto LAB_006fa42b;
                    }
                    if (uVar24 == uVar21) break;
                    *(int *)((long)puVar7 + uVar21 * 4 + 0x14) = iVar53;
                    uVar21 = uVar21 + 1;
                    uVar49 = uVar49 + (iVar44 == iVar53);
                    uVar45 = uVar45 + (iVar30 == iVar53);
                    uVar41 = uVar41 + (iVar55 <= iVar11);
                    iVar33 = iVar33 + -0x8000000;
                    bVar25 = bVar25 + 1;
                  }
                }
                goto LAB_006fab0c;
              }
LAB_006fab19:
              local_19b0 = local_19b0 + 1;
            } while (local_19b0 < local_c38 + iVar17);
          }
          pNVar40 = pNVar40 + 1;
        } while (pNVar40 < local_1238 + iVar16);
      }
      goto LAB_006fab4e;
    }
  }
  uVar38 = *(ulong *)pGVar57;
  uVar26 = (uint)uVar38;
  p->CutCount[0] = (double)(iVar17 * iVar16) + p->CutCount[0];
  if (0 < iVar16) {
    piVar47 = local_1238[0].pLeaves;
    pNVar40 = local_1238;
    do {
      if (0 < iVar17) {
        piVar51 = local_c38[0].pLeaves;
        pNVar58 = local_c38;
        do {
          uVar46 = *(uint *)&pNVar40->field_0x10;
          uVar41 = uVar46 >> 0x1b;
          uVar32 = *(uint *)&pNVar58->field_0x10;
          uVar45 = uVar32 >> 0x1b;
          if (((int)uVar31 < (int)(uVar45 + uVar41)) &&
             (uVar21 = pNVar58->Sign | pNVar40->Sign,
             uVar21 = uVar21 - (uVar21 >> 1 & 0x5555555555555555),
             uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333),
             (int)uVar31 <
             (int)(uint)(byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38))) goto LAB_006fa18c;
          p->CutCount[1] = p->CutCount[1] + 1.0;
          puVar7 = (ulong *)local_1930[(long)(int)uVar37 + -1];
          if ((uVar41 == uVar31) && (uVar45 == uVar31)) {
            uVar49 = uVar31;
            if (0x7ffffff < uVar46) {
              uVar21 = 0;
              do {
                if (piVar47[uVar21] != piVar51[uVar21]) goto LAB_006fa18c;
                *(int *)((long)puVar7 + uVar21 * 4 + 0x14) = piVar47[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
            }
LAB_006f9b73:
            *(uint *)(puVar7 + 2) = ((uint)puVar7[2] & 0x4000000) + uVar49 * 0x8000000 + 0x3ffffff;
            uVar21 = pNVar58->Sign | pNVar40->Sign;
            *puVar7 = uVar21;
            if (0 < (int)uVar37) {
              uVar46 = uVar49 & 0x1f;
              uVar48 = 0;
              do {
                puVar8 = (ulong *)local_1930[uVar48 - 1];
                uVar32 = (uint)puVar8[2] >> 0x1b;
                if ((uVar32 <= uVar46) && ((*puVar8 & ~uVar21) == 0)) {
                  if (uVar46 == uVar32) {
                    if ((uVar49 & 0x1f) == 0) goto LAB_006fa18c;
                    uVar42 = 0;
                    while (*(int *)((long)puVar7 + uVar42 * 4 + 0x14) ==
                           *(int *)((long)puVar8 + uVar42 * 4 + 0x14)) {
                      uVar42 = uVar42 + 1;
                      if (uVar46 == uVar42) goto LAB_006fa18c;
                    }
                  }
                  else {
                    if (uVar46 <= uVar32) {
LAB_006faeb0:
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                                    ,0x303,"int Nf_SetCutIsContainedOrder(Nf_Cut_t *, Nf_Cut_t *)");
                    }
                    if ((uint)puVar8[2] < 0x8000000) goto LAB_006fa18c;
                    uVar42 = 0;
                    uVar41 = 0;
                    do {
                      iVar18 = *(int *)((long)puVar8 + (long)(int)uVar41 * 4 + 0x14);
                      iVar33 = *(int *)((long)puVar7 + uVar42 * 4 + 0x14);
                      if (iVar18 < iVar33) break;
                      if ((iVar33 == iVar18) && (uVar41 = uVar41 + 1, uVar41 == uVar32))
                      goto LAB_006fa18c;
                      uVar42 = uVar42 + 1;
                    } while (uVar46 != uVar42);
                  }
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != uVar37);
            }
            p->CutCount[2] = p->CutCount[2] + 1.0;
            pVVar9 = p->vTtMem;
            uVar46 = *(uint *)&pNVar40->field_0x10;
            uVar32 = uVar46 >> 1 & 0x1ffffff;
            if (pVVar9->nEntries <= (int)uVar32) {
LAB_006fae91:
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            uVar41 = *(uint *)&pNVar58->field_0x10;
            uVar45 = uVar41 >> 1 & 0x1ffffff;
            if ((uint)pVVar9->nEntries <= uVar45) goto LAB_006fae91;
            uVar49 = (uint)puVar7[2];
            bVar25 = (byte)pVVar9->LogPageSze;
            uVar19 = uVar49 >> 0x1b;
            uVar42 = (ulong)uVar19;
            uVar21 = -(ulong)((uVar46 & 1) != uVar52) ^
                     pVVar9->ppPages[uVar32 >> (bVar25 & 0x1f)]
                     [(int)((uVar32 & pVVar9->PageMask) * pVVar9->nEntrySize)];
            uVar48 = -(ulong)((uVar41 & 1) != uVar34) ^
                     pVVar9->ppPages[uVar45 >> (bVar25 & 0x1f)]
                     [(int)((pVVar9->PageMask & uVar45) * pVVar9->nEntrySize)];
            uVar32 = (uVar46 >> 0x1b) - 1;
            if (0x7ffffff < uVar46 && 0x7ffffff < uVar49) {
              lVar35 = uVar42 * 0x18 + 0x936828;
              uVar43 = uVar42;
              do {
                uVar27 = uVar43 - 1;
                uVar28 = (ulong)uVar32;
                iVar18 = *(int *)((long)puVar7 + uVar27 * 4 + 0x14);
                if (iVar18 <= pNVar40->pLeaves[uVar28]) {
                  if (iVar18 != pNVar40->pLeaves[uVar28]) goto LAB_006fae34;
                  if (uVar28 < uVar27) {
                    bVar25 = (char)(-1 << ((byte)uVar32 & 0x1f)) +
                             (char)(1 << ((byte)uVar27 & 0x1f));
                    lVar29 = uVar28 * 0x90;
                    uVar21 = (uVar21 & *(ulong *)(lVar35 + lVar29)) >> (bVar25 & 0x3f) |
                             (*(ulong *)(lVar35 + -8 + lVar29) & uVar21) << (bVar25 & 0x3f) |
                             *(ulong *)(lVar35 + -0x10 + lVar29) & uVar21;
                  }
                  uVar32 = uVar32 - 1;
                }
              } while ((1 < uVar43) && (lVar35 = lVar35 + -0x18, uVar43 = uVar27, -1 < (int)uVar32))
              ;
            }
            if (uVar32 != 0xffffffff) {
LAB_006fae72:
              __assert_fail("k == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x594,"word Abc_Tt6Expand(word, int *, int, int *, int)");
            }
            uVar46 = (uVar41 >> 0x1b) - 1;
            if (0x7ffffff < uVar41 && 0x7ffffff < uVar49) {
              lVar35 = uVar42 * 0x18 + 0x936828;
              uVar43 = uVar42;
              do {
                uVar27 = uVar43 - 1;
                uVar28 = (ulong)uVar46;
                iVar18 = *(int *)((long)puVar7 + uVar27 * 4 + 0x14);
                if (iVar18 <= pNVar58->pLeaves[uVar28]) {
                  if (iVar18 != pNVar58->pLeaves[uVar28]) {
LAB_006fae34:
                    __assert_fail("pCut[i] == pCut0[k]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                  ,0x58f,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                  }
                  if (uVar28 < uVar27) {
                    bVar25 = (char)(-1 << ((byte)uVar46 & 0x1f)) +
                             (char)(1 << ((byte)uVar27 & 0x1f));
                    lVar29 = uVar28 * 0x90;
                    uVar48 = (uVar48 & *(ulong *)(lVar35 + lVar29)) >> (bVar25 & 0x3f) |
                             (*(ulong *)(lVar35 + -8 + lVar29) & uVar48) << (bVar25 & 0x3f) |
                             *(ulong *)(lVar35 + -0x10 + lVar29) & uVar48;
                  }
                  uVar46 = uVar46 - 1;
                }
              } while ((1 < uVar43) && (lVar35 = lVar35 + -0x18, uVar43 = uVar27, -1 < (int)uVar46))
              ;
            }
            if (uVar46 != 0xffffffff) goto LAB_006fae72;
            uVar43 = uVar48 & uVar21;
            if (((~uVar26 & 0x1fffffff) != 0 && -1 < (int)uVar26) &&
                (uVar26 & 0x1fffffff) < ((uint)(uVar38 >> 0x20) & 0x1fffffff)) {
              uVar43 = uVar48 ^ uVar21;
            }
            uVar46 = (uint)uVar43 & 1;
            wVar39 = -(ulong)uVar46 ^ uVar43;
            uVar32 = 0;
            uVar21 = wVar39;
            if (0x7ffffff < uVar49) {
              uVar48 = 0;
              lVar35 = 0x936838;
              pwVar54 = s_Truths6Neg;
              uVar32 = 0;
              do {
                bVar25 = (byte)(1 << ((byte)uVar48 & 0x1f));
                if ((*pwVar54 & (uVar21 >> (bVar25 & 0x3f) ^ uVar21)) != 0) {
                  lVar29 = (long)(int)uVar32;
                  if (lVar29 < (long)uVar48) {
                    *(undefined4 *)((long)puVar7 + lVar29 * 4 + 0x14) =
                         *(undefined4 *)((long)puVar7 + uVar48 * 4 + 0x14);
                    bVar25 = (char)(-1 << ((byte)uVar32 & 0x1f)) + bVar25;
                    lVar29 = lVar29 * 0x90;
                    uVar21 = (uVar21 & *(ulong *)(lVar35 + 8 + lVar29)) >> (bVar25 & 0x3f) |
                             (*(ulong *)(lVar35 + lVar29) & uVar21) << (bVar25 & 0x3f) |
                             *(ulong *)(lVar35 + -8 + lVar29) & uVar21;
                  }
                  uVar32 = uVar32 + 1;
                }
                uVar48 = uVar48 + 1;
                pwVar54 = pwVar54 + 1;
                lVar35 = lVar35 + 0x18;
              } while (uVar42 != uVar48);
            }
            local_1838[0].Sign = wVar39;
            if ((uVar32 != uVar19) &&
               (local_1838[0].Sign = uVar21, uVar21 = local_1940, (int)uVar19 <= (int)uVar32)) {
LAB_006faf4b:
              local_1838[0].Sign = wVar39;
              local_1940 = uVar21;
              __assert_fail("k < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x5b6,"int Abc_Tt6MinBase(word *, int *, int)");
            }
            *(uint *)(puVar7 + 2) = (uint)puVar7[2] & 0x7ffffff | uVar32 << 0x1b;
            if ((local_1838[0].Sign & 1) != 0) {
              __assert_fail("(int)(t & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x1d0,
                            "int Nf_CutComputeTruth6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, Nf_Cut_t *, int)"
                           );
            }
            uVar32 = Vec_MemHashInsert(p->vTtMem,&local_1838[0].Sign);
            if ((int)uVar32 < 0) {
LAB_006faeee:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10b,"int Abc_Var2Lit(int, int)");
            }
            uVar41 = (uint)puVar7[2];
            uVar46 = uVar41 & 0xfc000000 | uVar46 + (uVar32 & 0x1ffffff) * 2;
            *(uint *)(puVar7 + 2) = uVar46;
            *(uint *)(puVar7 + 2) =
                 uVar46 & 0xfbffffff | (uint)(p->vTt2Match->nSize <= (int)uVar32) << 0x1a;
            uVar46 = uVar41 >> 0x1b;
            if (uVar19 < uVar46) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x1d4,
                            "int Nf_CutComputeTruth6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, Nf_Cut_t *, int)"
                           );
            }
            if (uVar46 < uVar19) {
              if (uVar41 < 0x8000000) {
                uVar21 = 0;
              }
              else {
                uVar48 = 0;
                uVar21 = 0;
                do {
                  uVar21 = uVar21 | 1L << ((ulong)*(byte *)((long)puVar7 + uVar48 * 4 + 0x14) & 0x3f
                                          );
                  uVar48 = uVar48 + 1;
                } while (uVar46 != uVar48);
              }
              *puVar7 = uVar21;
            }
            uVar46 = uVar41 >> 0x1b;
            pJVar5 = p->pPars;
            if (pJVar5->nLutSize < (int)uVar46) goto LAB_006faecf;
            puVar7[1] = 0;
            fVar60 = 0.0;
            fVar62 = 0.0;
            if (0x7ffffff < uVar41) {
              uVar21 = 0;
              iVar18 = 0;
              do {
                iVar33 = *(int *)((long)puVar7 + uVar21 * 4 + 0x14);
                lVar35 = (long)iVar33;
                if ((lVar35 < 0) || ((p->vCutDelays).nSize <= iVar33)) goto LAB_006fae15;
                iVar44 = (p->vCutDelays).pArray[lVar35];
                if (iVar18 <= iVar44) {
                  iVar18 = iVar44;
                }
                *(int *)(puVar7 + 1) = iVar18;
                if ((p->vCutFlows).nSize <= iVar33) goto LAB_006fae53;
                fVar60 = fVar60 + (p->vCutFlows).pArray[lVar35];
                *(float *)((long)puVar7 + 0xc) = fVar60;
                uVar21 = uVar21 + 1;
              } while (uVar46 != uVar21);
              *(uint *)(puVar7 + 1) = (iVar18 + 1) - (uint)(uVar41 < 0x10000000);
              fVar62 = 0.0;
              if (0xfffffff < uVar41) {
                fVar62 = (float)(int)(uVar46 + pJVar5->nAreaTuner);
              }
            }
            *(float *)((long)puVar7 + 0xc) = (fVar60 + fVar62) / fVar59;
            uVar37 = Nf_SetAddCut(&local_1938,uVar37,uVar56);
          }
          else {
            iVar18 = 0;
            uVar49 = 0;
            if (uVar46 < 0x8000000) {
LAB_006f9ad6:
              if ((int)(uVar49 + uVar45) <= (int)(iVar18 + uVar31)) {
                if (iVar18 < (int)uVar45) {
                  lVar35 = 0;
                  do {
                    *(int *)((long)puVar7 + lVar35 * 4 + (long)(int)uVar49 * 4 + 0x14) =
                         piVar51[iVar18 + lVar35];
                    lVar35 = lVar35 + 1;
                  } while ((ulong)uVar45 - (long)iVar18 != lVar35);
LAB_006f9b71:
                  uVar49 = uVar49 + (int)lVar35;
                }
                goto LAB_006f9b73;
              }
            }
            else {
              iVar33 = 0;
              uVar49 = 0;
              if (uVar32 < 0x8000000) {
LAB_006f9b33:
                if ((int)(uVar49 + uVar41) <= (int)(iVar33 + uVar31)) {
                  if (iVar33 < (int)uVar41) {
                    lVar35 = 0;
                    do {
                      *(int *)((long)puVar7 + lVar35 * 4 + (long)(int)uVar49 * 4 + 0x14) =
                           piVar47[iVar33 + lVar35];
                      lVar35 = lVar35 + 1;
                    } while ((ulong)uVar41 - (long)iVar33 != lVar35);
                    goto LAB_006f9b71;
                  }
                  goto LAB_006f9b73;
                }
              }
              else if (uVar31 != 0) {
                uVar21 = 0;
                iVar33 = 0;
                iVar44 = 0;
                do {
                  iVar18 = pNVar40->pLeaves[iVar33];
                  iVar30 = pNVar58->pLeaves[iVar44];
                  if (iVar18 < iVar30) {
                    iVar33 = iVar33 + 1;
                    *(int *)((long)puVar7 + uVar21 * 4 + 0x14) = iVar18;
                    iVar18 = iVar44;
                    if ((int)uVar41 <= iVar33) {
LAB_006fa1b5:
                      uVar49 = (int)uVar21 + 1;
                      goto LAB_006f9ad6;
                    }
                  }
                  else {
                    if (iVar30 < iVar18) {
                      *(int *)((long)puVar7 + uVar21 * 4 + 0x14) = iVar30;
                    }
                    else {
                      iVar33 = iVar33 + 1;
                      *(int *)((long)puVar7 + uVar21 * 4 + 0x14) = iVar18;
                      iVar18 = iVar44 + 1;
                      if ((int)uVar41 <= iVar33) goto LAB_006fa1b5;
                    }
                    iVar44 = iVar44 + 1;
                    if ((int)uVar45 <= iVar44) {
                      uVar49 = (int)uVar21 + 1;
                      goto LAB_006f9b33;
                    }
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
            }
          }
LAB_006fa18c:
          pNVar58 = pNVar58 + 1;
          piVar51 = piVar51 + 0xc;
        } while (pNVar58 < local_c38 + iVar17);
      }
      pNVar40 = pNVar40 + 1;
      piVar47 = piVar47 + 0xc;
    } while (pNVar40 < local_1238 + iVar16);
  }
LAB_006fab4e:
  if (((int)uVar37 < 1) || ((int)uVar56 <= (int)uVar37)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x3b8,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
  }
  if (iObj < (p->vCutFlows).nSize) {
    (p->vCutFlows).pArray[(uint)iObj] = local_1938->Flow;
    if ((p->vCutDelays).nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vCutDelays).pArray[(uint)iObj] = local_1938->Delay;
    uVar24 = (ulong)uVar37;
    iVar16 = 1;
    uVar21 = 0;
    do {
      lVar35 = uVar21 - 1;
      uVar21 = uVar21 + 1;
      iVar16 = iVar16 + (*(uint *)(local_1930[lVar35] + 0x10) >> 0x1b) + 1;
    } while (uVar24 != uVar21);
    uVar31 = p->iCur;
    if (0xffff < (uVar31 & 0xffff) + iVar16) {
      uVar31 = (uVar31 & 0xffff0000) + 0x10000;
      p->iCur = uVar31;
    }
    uVar56 = (p->vPages).nSize;
    uVar34 = (int)uVar31 >> 0x10;
    if (uVar56 == uVar34) {
      pvVar22 = malloc(0x40000);
      if (uVar56 == (p->vPages).nCap) {
        if ((int)uVar56 < 0x10) {
          ppvVar23 = (p->vPages).pArray;
          if (ppvVar23 == (void **)0x0) {
            ppvVar23 = (void **)malloc(0x80);
          }
          else {
            ppvVar23 = (void **)realloc(ppvVar23,0x80);
          }
          (p->vPages).pArray = ppvVar23;
          (p->vPages).nCap = 0x10;
        }
        else {
          ppvVar23 = (p->vPages).pArray;
          if (ppvVar23 == (void **)0x0) {
            ppvVar23 = (void **)malloc((ulong)uVar56 << 4);
          }
          else {
            ppvVar23 = (void **)realloc(ppvVar23,(ulong)uVar56 << 4);
          }
          (p->vPages).pArray = ppvVar23;
          (p->vPages).nCap = uVar56 * 2;
        }
      }
      else {
        ppvVar23 = (p->vPages).pArray;
      }
      iVar17 = (p->vPages).nSize;
      uVar56 = iVar17 + 1;
      (p->vPages).nSize = uVar56;
      ppvVar23[iVar17] = pvVar22;
      uVar31 = p->iCur;
      uVar34 = (int)uVar31 >> 0x10;
    }
    p->iCur = iVar16 + uVar31;
    if ((-1 < (int)uVar34) && ((int)uVar34 < (int)uVar56)) {
      puVar1 = (uint *)((long)(p->vPages).pArray[uVar34] + (ulong)(uVar31 & 0xffff) * 4);
      *puVar1 = uVar37;
      uVar21 = 0;
      do {
        lVar35 = local_1930[uVar21 - 1];
        puVar1[1] = (*(uint *)(lVar35 + 0x10) & 0x3ffffff) << 5 | *(uint *)(lVar35 + 0x10) >> 0x1b;
        memcpy(puVar1 + 2,(void *)(lVar35 + 0x14),
               (ulong)(*(uint *)(lVar35 + 0x10) >> 0x19 & 0xfffffffc));
        puVar1 = puVar1 + 1 + (*(uint *)(lVar35 + 0x10) >> 0x1b);
        uVar21 = uVar21 + 1;
      } while (uVar24 != uVar21);
      if (iObj < (p->vCutSets).nSize) {
        (p->vCutSets).pArray[(uint)iObj] = uVar31;
        p->CutCount[3] = (double)(int)uVar37 + p->CutCount[3];
        uVar21 = 0;
        uVar31 = 0;
        do {
          uVar31 = uVar31 + ((*(byte *)(local_1930[uVar21 - 1] + 0x13) & 4) == 0);
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        p->CutCount[4] = (double)(int)uVar31 + p->CutCount[4];
        p->nCutUseAll = p->nCutUseAll + (uint)(uVar31 == uVar37);
        uVar21 = 0;
        iVar16 = 0;
        do {
          if ((*(uint *)(local_1930[uVar21 - 1] + 0x10) >> 0x1a & 1) == 0) {
            uVar31 = *(uint *)(local_1930[uVar21 - 1] + 0x10) >> 1 & 0x1ffffff;
            if (p->vTt2Match->nSize <= (int)uVar31) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            iVar16 = iVar16 + *(int *)((long)&p->vTt2Match->pArray->nSize + (ulong)(uVar31 << 4)) /
                              2;
          }
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        p->CutCount[5] = (double)iVar16 + p->CutCount[5];
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
    ;
    __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
  }
  else {
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
    ;
    __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
  }
  __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
LAB_006fa42b:
  do {
    puVar8 = (ulong *)local_1930[uVar21 - 1];
    uVar46 = (uint)puVar8[2] >> 0x1b;
    if ((uVar46 <= uVar26) && ((*puVar8 & ~uVar38) == 0)) {
      if (uVar26 == uVar46) {
        if (iVar33 == -0x3ffffff) goto LAB_006fab0c;
        uVar48 = 0;
        while (*(int *)((long)puVar7 + uVar48 * 4 + 0x14) ==
               *(int *)((long)puVar8 + uVar48 * 4 + 0x14)) {
          uVar48 = uVar48 + 1;
          if ((bVar25 & 0x1f) == uVar48) goto LAB_006fab0c;
        }
      }
      else {
        if (uVar26 <= uVar46) goto LAB_006faeb0;
        if ((uint)puVar8[2] < 0x8000000) goto LAB_006fab0c;
        uVar48 = 0;
        uVar32 = 0;
        do {
          iVar44 = *(int *)((long)puVar8 + (long)(int)uVar32 * 4 + 0x14);
          iVar30 = *(int *)((long)puVar7 + uVar48 * 4 + 0x14);
          if (iVar44 < iVar30) break;
          if ((iVar30 == iVar44) && (uVar32 = uVar32 + 1, uVar32 == uVar46)) goto LAB_006fab0c;
          uVar48 = uVar48 + 1;
        } while ((bVar25 & 0x1f) != uVar48);
      }
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != uVar37);
LAB_006fa4c2:
  p->CutCount[2] = p->CutCount[2] + 1.0;
  pVVar9 = p->vTtMem;
  uVar26 = *(uint *)&pNVar40->field_0x10;
  uVar32 = uVar26 >> 1 & 0x1ffffff;
  uVar46 = pVVar9->nEntries;
  if ((int)uVar46 <= (int)uVar32) goto LAB_006fae91;
  bVar25 = (byte)pVVar9->LogPageSze;
  uVar41 = *(uint *)&local_19b0->field_0x10;
  uVar45 = uVar41 >> 1 & 0x1ffffff;
  if (uVar46 <= uVar45) goto LAB_006fae91;
  uVar49 = *(uint *)&pNVar58->field_0x10;
  uVar19 = uVar49 >> 1 & 0x1ffffff;
  if (uVar46 <= uVar19) goto LAB_006fae91;
  uVar46 = (uint)puVar7[2];
  uVar50 = uVar46 >> 0x1b;
  uVar42 = (ulong)uVar50;
  ppwVar10 = pVVar9->ppPages;
  iVar33 = pVVar9->nEntrySize;
  uVar2 = pVVar9->PageMask;
  uVar21 = -(ulong)((uVar26 & 1) != uVar52) ^
           ppwVar10[uVar32 >> (bVar25 & 0x1f)][(int)((uVar32 & uVar2) * iVar33)];
  uVar38 = -(ulong)((uVar41 & 1) != uVar34) ^
           ppwVar10[uVar45 >> (bVar25 & 0x1f)][(int)((uVar45 & uVar2) * iVar33)];
  uVar48 = -(ulong)((uVar49 & 1) != local_197c) ^
           ppwVar10[uVar19 >> (bVar25 & 0x1f)][(int)((uVar19 & uVar2) * iVar33)];
  uVar32 = (uVar26 >> 0x1b) - 1;
  if (0x7ffffff < uVar26 && 0x7ffffff < uVar46) {
    lVar35 = uVar42 * 0x18 + 0x936828;
    uVar43 = uVar42;
    do {
      uVar27 = uVar43 - 1;
      uVar28 = (ulong)uVar32;
      iVar33 = *(int *)((long)puVar7 + uVar27 * 4 + 0x14);
      if (iVar33 <= pNVar40->pLeaves[uVar28]) {
        if (iVar33 != pNVar40->pLeaves[uVar28]) goto LAB_006fae34;
        if (uVar28 < uVar27) {
          bVar25 = (char)(-1 << ((byte)uVar32 & 0x1f)) + (char)(1 << ((byte)uVar27 & 0x1f));
          lVar29 = uVar28 * 0x90;
          uVar21 = (uVar21 & *(ulong *)(lVar35 + lVar29)) >> (bVar25 & 0x3f) |
                   (*(ulong *)(lVar35 + -8 + lVar29) & uVar21) << (bVar25 & 0x3f) |
                   *(ulong *)(lVar35 + -0x10 + lVar29) & uVar21;
        }
        uVar32 = uVar32 - 1;
      }
    } while ((1 < uVar43) && (lVar35 = lVar35 + -0x18, uVar43 = uVar27, -1 < (int)uVar32));
  }
  if (uVar32 != 0xffffffff) goto LAB_006fae72;
  uVar26 = (uVar41 >> 0x1b) - 1;
  if (0x7ffffff < uVar41 && 0x7ffffff < uVar46) {
    lVar35 = uVar42 * 0x18 + 0x936828;
    uVar43 = uVar42;
    do {
      uVar27 = uVar43 - 1;
      uVar28 = (ulong)uVar26;
      iVar33 = *(int *)((long)puVar7 + uVar27 * 4 + 0x14);
      if (iVar33 <= local_19b0->pLeaves[uVar28]) {
        if (iVar33 != local_19b0->pLeaves[uVar28]) goto LAB_006fae34;
        if (uVar28 < uVar27) {
          bVar25 = (char)(-1 << ((byte)uVar26 & 0x1f)) + (char)(1 << ((byte)uVar27 & 0x1f));
          lVar29 = uVar28 * 0x90;
          uVar38 = (uVar38 & *(ulong *)(lVar35 + lVar29)) >> (bVar25 & 0x3f) |
                   (*(ulong *)(lVar35 + -8 + lVar29) & uVar38) << (bVar25 & 0x3f) |
                   *(ulong *)(lVar35 + -0x10 + lVar29) & uVar38;
        }
        uVar26 = uVar26 - 1;
      }
    } while ((1 < uVar43) && (lVar35 = lVar35 + -0x18, uVar43 = uVar27, -1 < (int)uVar26));
  }
  if (uVar26 != 0xffffffff) goto LAB_006fae72;
  uVar26 = (uVar49 >> 0x1b) - 1;
  if (0x7ffffff < uVar49 && 0x7ffffff < uVar46) {
    lVar35 = uVar42 * 0x18 + 0x936828;
    uVar43 = uVar42;
    do {
      uVar27 = uVar43 - 1;
      uVar28 = (ulong)uVar26;
      iVar33 = *(int *)((long)puVar7 + uVar27 * 4 + 0x14);
      if (iVar33 <= pNVar58->pLeaves[uVar28]) {
        if (iVar33 != pNVar58->pLeaves[uVar28]) goto LAB_006fae34;
        if (uVar28 < uVar27) {
          bVar25 = (char)(-1 << ((byte)uVar26 & 0x1f)) + (char)(1 << ((byte)uVar27 & 0x1f));
          lVar29 = uVar28 * 0x90;
          uVar48 = (uVar48 & *(ulong *)(lVar35 + lVar29)) >> (bVar25 & 0x3f) |
                   (*(ulong *)(lVar35 + -8 + lVar29) & uVar48) << (bVar25 & 0x3f) |
                   *(ulong *)(lVar35 + -0x10 + lVar29) & uVar48;
        }
        uVar26 = uVar26 - 1;
      }
    } while ((1 < uVar43) && (lVar35 = lVar35 + -0x18, uVar43 = uVar27, -1 < (int)uVar26));
  }
  if (uVar26 != 0xffffffff) goto LAB_006fae72;
  uVar21 = (uVar38 ^ uVar21) & uVar48 ^ uVar21;
  uVar32 = (uint)uVar21 & 1;
  uVar21 = -(ulong)uVar32 ^ uVar21;
  uVar26 = 0;
  uVar38 = uVar21;
  if (0x7ffffff < uVar46) {
    uVar48 = 0;
    lVar35 = 0x936838;
    pwVar54 = s_Truths6Neg;
    uVar26 = 0;
    do {
      bVar25 = (byte)(1 << ((byte)uVar48 & 0x1f));
      if ((*pwVar54 & (uVar38 >> (bVar25 & 0x3f) ^ uVar38)) != 0) {
        lVar29 = (long)(int)uVar26;
        if (lVar29 < (long)uVar48) {
          *(undefined4 *)((long)puVar7 + lVar29 * 4 + 0x14) =
               *(undefined4 *)((long)puVar7 + uVar48 * 4 + 0x14);
          bVar25 = (char)(-1 << ((byte)uVar26 & 0x1f)) + bVar25;
          lVar29 = lVar29 * 0x90;
          uVar38 = (uVar38 & *(ulong *)(lVar35 + 8 + lVar29)) >> (bVar25 & 0x3f) |
                   (*(ulong *)(lVar35 + lVar29) & uVar38) << (bVar25 & 0x3f) |
                   *(ulong *)(lVar35 + -8 + lVar29) & uVar38;
        }
        uVar26 = uVar26 + 1;
      }
      uVar48 = uVar48 + 1;
      pwVar54 = pwVar54 + 1;
      lVar35 = lVar35 + 0x18;
    } while (uVar42 != uVar48);
  }
  local_1940 = uVar21;
  if ((uVar26 != uVar50) &&
     (local_1940 = uVar38, wVar39 = local_1838[0].Sign, (int)uVar50 <= (int)uVar26))
  goto LAB_006faf4b;
  *(uint *)(puVar7 + 2) = (uint)puVar7[2] & 0x7ffffff | uVar26 << 0x1b;
  if ((local_1940 & 1) != 0) {
    __assert_fail("(int)(t & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x1e6,
                  "int Nf_CutComputeTruthMux6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, int, Nf_Cut_t *)"
                 );
  }
  uVar26 = Vec_MemHashInsert(p->vTtMem,&local_1940);
  if ((int)uVar26 < 0) goto LAB_006faeee;
  uVar46 = (uint)puVar7[2];
  uVar32 = uVar46 & 0xfc000000 | uVar32 + (uVar26 & 0x1ffffff) * 2;
  *(uint *)(puVar7 + 2) = uVar32;
  *(uint *)(puVar7 + 2) = uVar32 & 0xfbffffff | (uint)(p->vTt2Match->nSize <= (int)uVar26) << 0x1a;
  uVar26 = uVar46 >> 0x1b;
  if (uVar50 < uVar26) {
    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x1ea,
                  "int Nf_CutComputeTruthMux6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, int, Nf_Cut_t *)"
                 );
  }
  if (uVar26 < uVar50) {
    if (uVar46 < 0x8000000) {
      uVar21 = 0;
    }
    else {
      uVar38 = 0;
      uVar21 = 0;
      do {
        uVar21 = uVar21 | 1L << ((ulong)*(byte *)((long)puVar7 + uVar38 * 4 + 0x14) & 0x3f);
        uVar38 = uVar38 + 1;
      } while (uVar26 != uVar38);
    }
    *puVar7 = uVar21;
  }
  uVar26 = uVar46 >> 0x1b;
  pJVar5 = p->pPars;
  if (pJVar5->nLutSize < (int)uVar26) goto LAB_006faecf;
  puVar7[1] = 0;
  fVar60 = 0.0;
  fVar62 = 0.0;
  if (0x7ffffff < uVar46) {
    uVar21 = 0;
    iVar33 = 0;
    do {
      iVar44 = *(int *)((long)puVar7 + uVar21 * 4 + 0x14);
      lVar35 = (long)iVar44;
      if ((lVar35 < 0) || ((p->vCutDelays).nSize <= iVar44)) goto LAB_006fae15;
      iVar30 = (p->vCutDelays).pArray[lVar35];
      if (iVar33 <= iVar30) {
        iVar33 = iVar30;
      }
      *(int *)(puVar7 + 1) = iVar33;
      if ((p->vCutFlows).nSize <= iVar44) goto LAB_006fae53;
      fVar60 = fVar60 + (p->vCutFlows).pArray[lVar35];
      *(float *)((long)puVar7 + 0xc) = fVar60;
      uVar21 = uVar21 + 1;
    } while (uVar26 != uVar21);
    *(uint *)(puVar7 + 1) = (iVar33 + 1) - (uint)(uVar46 < 0x10000000);
    fVar62 = 0.0;
    if (0xfffffff < uVar46) {
      fVar62 = (float)(int)(uVar26 + pJVar5->nAreaTuner);
    }
  }
  *(float *)((long)puVar7 + 0xc) = (fVar60 + fVar62) / fVar59;
  uVar37 = Nf_SetAddCut(&local_1938,uVar37,uVar56);
LAB_006fab0c:
  pNVar58 = pNVar58 + 1;
  if (local_1838 + iVar18 <= pNVar58) goto LAB_006fab19;
  goto LAB_006fa285;
}

Assistant:

void Nf_ObjMergeOrder( Nf_Man_t * p, int iObj )
{
    Nf_Cut_t pCuts0[NF_CUT_MAX], pCuts1[NF_CUT_MAX], pCuts[NF_CUT_MAX], * pCutsR[NF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    //Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    float dFlowRefs  = Nf_ObjFlowRefs(p, iObj, 0) + Nf_ObjFlowRefs(p, iObj, 1);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Nf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Nf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Nf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsUse, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Nf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        int nCuts2  = Nf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Nf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Nf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 10000 == 0 )
//    if ( iObj == 1090 )
    {
        printf( "*** Obj = %d  Useful = %d\n", iObj, Nf_ManCountUseful(pCutsR, nCutsR) );
        for ( i = 0; i < nCutsR; i++ )
            Nf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Nf_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Nf_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Nf_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Nf_ManSaveCuts(p, pCutsR, nCutsR, 0);
    p->CutCount[3] += nCutsR;
    nCutsUse = Nf_ManCountUseful(pCutsR, nCutsR);
    p->CutCount[4] += nCutsUse;
    p->nCutUseAll  += nCutsUse == nCutsR;
    p->CutCount[5] += Nf_ManCountMatches(p, pCutsR, nCutsR);
}